

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.cpp
# Opt level: O1

void * P33xThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *__s;
  ulong uVar12;
  char *pcVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  CHRONO chrono_period;
  char szTemp [256];
  P33X p33x;
  char szSaveFilePath [256];
  interval local_848;
  double local_830;
  int local_828;
  int local_824;
  timespec local_820;
  double local_810;
  double dStack_808;
  double local_800;
  double dStack_7f8;
  timespec local_7f0;
  int local_7e0;
  timeval local_7d8;
  double local_7c8;
  double local_7c0;
  interval local_7b8;
  interval local_7a0;
  char local_788 [256];
  P33X local_688;
  char local_138 [264];
  
  memset(&local_688,0,0x550);
  iVar3 = clock_getres(4,&local_7f0);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_820), iVar3 == 0)) {
    local_7e0 = 0;
    local_810 = 0.0;
    dStack_808 = 0.0;
    local_800 = 0.0;
    dStack_7f8 = 0.0;
  }
  iVar3 = 100;
  uVar14 = 0;
  uVar15 = 0;
  __s = "P33x disconnection failed.";
  bVar1 = false;
  local_828 = 0;
  do {
    local_830 = (double)CONCAT44(uVar15,uVar14);
    local_824 = iVar3;
    while( true ) {
      if (local_7e0 == 0) {
        clock_gettime(4,(timespec *)&local_848);
        local_810 = local_848.inf;
        dStack_808 = local_848.sup;
        local_848.inf =
             (double)(((long)local_848.inf + (long)local_800 +
                      ((long)local_848.sup + (long)dStack_7f8) / 1000000000) - local_820.tv_sec);
        local_848.sup =
             (double)(((long)local_848.sup + (long)dStack_7f8) % 1000000000 - local_820.tv_nsec);
        if ((long)local_848.sup < 0) {
          local_848.inf = (double)(((long)local_848.inf + (long)local_848.sup / 1000000000) - 1);
          local_848.sup = (double)((long)local_848.sup % 1000000000 + 1000000000);
        }
        local_800 = local_848.inf;
        dStack_7f8 = local_848.sup;
      }
      iVar4 = clock_getres(4,&local_7f0);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_820), iVar4 == 0)) {
        local_7e0 = 0;
        local_800 = 0.0;
        dStack_7f8 = 0.0;
        local_810 = 0.0;
        dStack_808 = 0.0;
      }
      local_848.inf = (double)((long)iVar3 / 1000);
      local_848.sup = (double)(((long)iVar3 % 1000) * 1000000);
      nanosleep((timespec *)&local_848,(timespec *)0x0);
      iVar4 = local_824;
      if (bPauseP33x == 0) break;
      if (bVar1) {
        puts("P33x Paused.");
        iVar4 = CloseRS232Port(&local_688.RS232Port);
        pcVar13 = "P33x disconnection failed.";
        if (iVar4 == 0) {
          pcVar13 = "P33x disconnected.";
        }
        puts(pcVar13);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001b1b81;
      }
      local_848.inf = 0.0;
      local_848.sup = 4.94065645841247e-316;
      bVar1 = false;
      nanosleep((timespec *)&local_848,(timespec *)0x0);
    }
    if (bRestartP33x != 0) {
      if (bVar1) {
        puts("Restarting a P33x.");
        iVar3 = CloseRS232Port(&local_688.RS232Port);
        pcVar13 = "P33x disconnection failed.";
        if (iVar3 == 0) {
          pcVar13 = "P33x disconnected.";
        }
        puts(pcVar13);
      }
      bRestartP33x = 0;
      bVar1 = false;
    }
    iVar3 = iVar4;
    if (bVar1) {
      local_848.inf = (double)((ulong)local_848.inf & 0xffffffff00000000);
      iVar5 = ReadChannelP33x(&local_688,'\x01',(float *)&local_848);
      if (iVar5 == 0) {
        local_830 = (double)local_848.inf._0_4_;
        local_688.LastPressure = local_830;
        iVar4 = gettimeofday(&local_7d8,(__timezone_ptr_t)0x0);
        if (iVar4 != 0) {
          local_7d8.tv_sec = 0;
          local_7d8.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = local_830;
        local_7c0 = ((local_830 - local_688.PressureRef) * -100000.0) /
                    (local_688.WaterDensity * 9.80665);
        interval::interval(&local_7a0,&local_7c0);
        local_7c8 = -z_pressure_acc;
        interval::interval(&local_7b8,&local_7c8,&z_pressure_acc);
        operator+(&local_7a0,&local_7b8);
        interval::operator=((interval *)&z_pressure,&local_848);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        if (local_688.bSaveRawData != 0) {
          fprintf((FILE *)local_688.pfSaveFile,"%d;%d;%f;\n",SUB84(local_830,0),
                  local_7d8.tv_sec & 0xffffffff,local_7d8.tv_usec & 0xffffffff);
LAB_001b1b19:
          fflush((FILE *)local_688.pfSaveFile);
        }
        bVar1 = true;
        bVar2 = false;
      }
      else {
        puts("Connection to a P33x lost.");
        iVar3 = CloseRS232Port(&local_688.RS232Port);
        if (iVar3 == 0) {
          pcVar13 = "P33x disconnected.";
        }
        else {
          pcVar13 = "P33x disconnection failed.";
        }
        puts(pcVar13);
LAB_001b1998:
        bVar1 = false;
        bVar2 = true;
        iVar3 = iVar4;
      }
    }
    else {
      iVar5 = ConnectP33x(&local_688,"P33x0.txt");
      iVar3 = local_688.threadperiod;
      if (iVar5 != 0) {
        local_848.inf = 4.94065645841247e-324;
        local_848.sup = 0.0;
        nanosleep((timespec *)&local_848,(timespec *)0x0);
        goto LAB_001b1998;
      }
      if ((FILE *)local_688.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_688.pfSaveFile);
        local_688.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_688.bSaveRawData != 0) &&
         (bVar2 = false, (FILE *)local_688.pfSaveFile == (FILE *)0x0)) {
        if (local_688.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_788,"p33x",5);
        }
        else {
          sprintf(local_788,"%.127s",local_688.szCfgFilePath);
        }
        sVar7 = strlen(local_788);
        uVar6 = (uint)sVar7;
        uVar12 = sVar7 & 0xffffffff;
        uVar8 = (int)uVar6 >> 0x1f & uVar6;
        uVar11 = sVar7 & 0xffffffff;
        do {
          uVar12 = uVar12 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar8 - 1);
          uVar9 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar9 = uVar10;
        } while (local_788[uVar12 & 0xffffffff] != '.');
        if ((int)uVar9 <= (int)uVar6 && 1 < (int)uVar9) {
          memset(local_788 + uVar11,0,sVar7 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar13 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.csv",local_788,pcVar13);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_688.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_688.pfSaveFile != (FILE *)0x0) {
          fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)local_688.pfSaveFile);
          goto LAB_001b1b19;
        }
        puts("Unable to create P33x data file.");
        bVar2 = false;
        goto LAB_001b1b81;
      }
    }
    uVar15 = (undefined4)((ulong)local_830 >> 0x20);
    if ((bVar2) &&
       (local_828 = local_828 + 1, ExitOnErrorCount <= local_828 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    uVar14 = SUB84(local_830,0);
    if (bExit != 0) {
LAB_001b1b81:
      if (local_7e0 == 0) {
        clock_gettime(4,(timespec *)&local_848);
        local_810 = local_848.inf;
        dStack_808 = local_848.sup;
        local_848.inf =
             (double)(((long)local_848.inf + (long)local_800 +
                      ((long)local_848.sup + (long)dStack_7f8) / 1000000000) - local_820.tv_sec);
        local_848.sup =
             (double)(((long)local_848.sup + (long)dStack_7f8) % 1000000000 - local_820.tv_nsec);
        if ((long)local_848.sup < 0) {
          local_848.inf = (double)(((long)local_848.inf + (long)local_848.sup / 1000000000) - 1);
          local_848.sup = (double)((long)local_848.sup % 1000000000 + 1000000000);
        }
        local_800 = local_848.inf;
        dStack_7f8 = local_848.sup;
      }
      if ((FILE *)local_688.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_688.pfSaveFile);
        local_688.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_688.RS232Port);
        if (iVar3 == 0) {
          __s = "P33x disconnected.";
        }
        puts(__s);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X p33x;
	struct timeval tv;
	double pressure = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&p33x, 0, sizeof(P33X));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseP33x)
		{
			if (bConnected)
			{
				printf("P33x Paused.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartP33x)
		{
			if (bConnected)
			{
				printf("Restarting a P33x.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			bRestartP33x = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectP33x(&p33x, "P33x0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = p33x.threadperiod;

				if (p33x.pfSaveFile != NULL)
				{
					fclose(p33x.pfSaveFile); 
					p33x.pfSaveFile = NULL;
				}
				if ((p33x.bSaveRawData)&&(p33x.pfSaveFile == NULL)) 
				{
					if (strlen(p33x.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", p33x.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "p33x");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					p33x.pfSaveFile = fopen(szSaveFilePath, "w");
					if (p33x.pfSaveFile == NULL) 
					{
						printf("Unable to create P33x data file.\n");
						break;
					}
					fprintf(p33x.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(p33x.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureP33x(&p33x, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				z_pressure = Pressure2Height(pressure, p33x.PressureRef, p33x.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (p33x.bSaveRawData)
				{
					fprintf(p33x.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(p33x.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a P33x lost.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}		
		}

		//printf("P33xThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (p33x.pfSaveFile != NULL)
	{
		fclose(p33x.pfSaveFile); 
		p33x.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectP33x(&p33x);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}